

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

void __thiscall FDecalLib::ParseColorchanger(FDecalLib *this,FScanner *sc)

{
  bool bVar1;
  uint32 other;
  FDecalColorerAnim *this_00;
  char *name;
  FDecalColorerAnim *local_50;
  FDecalColorerAnim *local_48;
  FDecalColorerAnim *fader;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_2c;
  int local_28;
  PalEntry goal;
  int decayTime;
  int startTime;
  FString faderName;
  FScanner *sc_local;
  FDecalLib *this_local;
  
  faderName.Chars = (char *)sc;
  FString::FString((FString *)&decayTime);
  goal.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)
                 (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
  local_28 = 0;
  PalEntry::PalEntry((PalEntry *)&local_2c.field_0,0);
  FScanner::MustGetString((FScanner *)faderName.Chars);
  FString::operator=((FString *)&decayTime,*faderName.Chars);
  FScanner::MustGetStringName((FScanner *)faderName.Chars,"{");
  while( true ) {
    FScanner::MustGetString((FScanner *)faderName.Chars);
    bVar1 = FScanner::Compare((FScanner *)faderName.Chars,"}");
    if (bVar1) break;
    bVar1 = FScanner::Compare((FScanner *)faderName.Chars,"FadeStart");
    if (bVar1) {
      FScanner::MustGetFloat((FScanner *)faderName.Chars);
      goal.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)
                     (int)(*(double *)(faderName.Chars + 0x18) * 35.0);
    }
    else {
      bVar1 = FScanner::Compare((FScanner *)faderName.Chars,"FadeTime");
      if (bVar1) {
        FScanner::MustGetFloat((FScanner *)faderName.Chars);
        local_28 = (int)(*(double *)(faderName.Chars + 0x18) * 35.0);
      }
      else {
        bVar1 = FScanner::Compare((FScanner *)faderName.Chars,"Color");
        if (bVar1) {
          FScanner::MustGetString((FScanner *)faderName.Chars);
          other = V_GetColor((DWORD *)0x0,(FScanner *)faderName.Chars);
          PalEntry::operator=((PalEntry *)&local_2c.field_0,other);
        }
        else {
          FScanner::ScriptError
                    ((FScanner *)faderName.Chars,"Unknown color changer parameter \'%s\'",
                     *(undefined8 *)faderName.Chars);
        }
      }
    }
  }
  this_00 = (FDecalColorerAnim *)operator_new(0x18);
  name = FString::operator_cast_to_char_((FString *)&decayTime);
  FDecalColorerAnim::FDecalColorerAnim(this_00,name);
  *(anon_union_4_2_12391d7c_for_PalEntry_0 *)&(this_00->super_FDecalAnimator).field_0xc =
       (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)goal.field_0;
  this_00->DecayTime = local_28;
  (this_00->GoalColor).field_0 = local_2c;
  local_50 = this_00;
  local_48 = this_00;
  TArray<FDecalAnimator_*,_FDecalAnimator_*>::Push
            (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>,
             (FDecalAnimator **)&local_50);
  FString::~FString((FString *)&decayTime);
  return;
}

Assistant:

void FDecalLib::ParseColorchanger (FScanner &sc)
{
	FString faderName;
	int startTime = 0, decayTime = 0;
	PalEntry goal = 0;

	sc.MustGetString ();
	faderName = sc.String;
	sc.MustGetStringName ("{");
	
	for (;;)
	{
		sc.MustGetString ();
		if (sc.Compare ("}"))
		{
			FDecalColorerAnim *fader = new FDecalColorerAnim (faderName);
			fader->DecayStart = startTime;
			fader->DecayTime = decayTime;
			fader->GoalColor = goal;
			Animators.Push (fader);
			break;
		}
		else if (sc.Compare ("FadeStart"))
		{
			sc.MustGetFloat ();
			startTime = (int)(sc.Float * TICRATE);
		}
		else if (sc.Compare ("FadeTime"))
		{
			sc.MustGetFloat ();
			decayTime = (int)(sc.Float * TICRATE);
		}
		else if (sc.Compare ("Color"))
		{
			sc.MustGetString ();
			goal = V_GetColor (NULL, sc);
		}
		else
		{
			sc.ScriptError ("Unknown color changer parameter '%s'", sc.String);
		}
	}
}